

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O0

void set_target_fps_aux(void)

{
  uint maxInterval;
  uint currentInterval;
  GLXDrawable drawable;
  Display *dpy;
  int interval;
  uint local_20;
  uint local_1c;
  GLXDrawable local_18;
  Display *local_10;
  uint local_4;
  
  local_4 = (uint)(g_time_for_frame * 60.0 + 0.5);
  if (SwapIntervalEXT != (PFNGLXSWAPINTERVALEXTPROC)0x0) {
    local_10 = (Display *)glXGetCurrentDisplay();
    local_18 = glXGetCurrentDrawable();
    (*SwapIntervalEXT)(local_10,local_18,local_4);
    glXQueryDrawable(local_10,local_18,0x20f1,&local_1c);
    if (local_4 != local_1c) {
      glXQueryDrawable(local_10,local_18,0x20f2,&local_20);
      fprintf(_stderr,"Cannot set target swap interval. Current swap interval is %d (max: %d)\n",
              (ulong)local_1c,(ulong)local_20);
    }
    g_use_hardware_sync = true;
  }
  return;
}

Assistant:

void
set_target_fps_aux() {
    // Assuming the monitor refresh rate is 60 hz
    int interval = (int) ((60.0 * g_time_for_frame) + 0.5);

#if defined(_WIN32) || defined(WIN32)

    if (SwapIntervalEXT != 0x0) {
        bool success = SwapIntervalEXT(interval);
        if (GetSwapIntervalEXT != 0x0) {
            int currentInterval = GetSwapIntervalEXT();
            if (interval != currentInterval) {
                fprintf(stderr, "Cannot set target swap interval. Current swap interval is %d\n", currentInterval);
            }
        }
        else if (success == false) {
            fprintf(stderr, "Cannot set target swap interval.\n");
        }
        g_use_hardware_sync = true;
    }

#elif defined(linux)
    #define kGLX_SWAP_INTERVAL_EXT               0x20F1
    #define kGLX_MAX_SWAP_INTERVAL_EXT           0x20F2

    if (SwapIntervalEXT != 0x0) {
        Display         *dpy     = glXGetCurrentDisplay();
        GLXDrawable     drawable = glXGetCurrentDrawable();
        unsigned int    currentInterval, maxInterval;

        SwapIntervalEXT(dpy, drawable, interval);
        glXQueryDrawable(dpy, drawable, kGLX_SWAP_INTERVAL_EXT, &currentInterval);
        if (interval != (int)currentInterval) {
            glXQueryDrawable(dpy, drawable, kGLX_MAX_SWAP_INTERVAL_EXT, &maxInterval);
            fprintf(stderr, "Cannot set target swap interval. Current swap interval is %d (max: %d)\n", currentInterval, maxInterval);
        }
        g_use_hardware_sync = true;
    }

#endif
}